

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.c
# Opt level: O2

uint32_t ixgbe_rx_batch(ixy_device *ixy,uint16_t queue_id,pkt_buf **bufs,uint32_t num_bufs)

{
  long *plVar1;
  _Bool _Var2;
  ushort uVar3;
  interrupt_queues *piVar4;
  pkt_buf *ppVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint uVar8;
  pkt_buf *ppVar9;
  uint64_t uVar10;
  undefined8 uVar11;
  uint uVar12;
  uint uVar13;
  char *__format;
  uint uVar14;
  long *plVar15;
  ulong uVar16;
  ulong uVar17;
  interrupt_queues *local_58;
  
  _Var2 = (ixy->interrupts).interrupts_enabled;
  uVar16 = (ulong)queue_id;
  if (_Var2 == false) {
    local_58 = (interrupt_queues *)0x0;
  }
  else {
    piVar4 = (ixy->interrupts).queues;
    local_58 = piVar4 + uVar16;
    if (piVar4[uVar16].interrupt_enabled == true) {
      vfio_epoll_wait(local_58->vfio_epoll_fd,10,(ixy->interrupts).timeout_ms);
    }
  }
  plVar1 = (long *)(ixy[1].driver_name + uVar16 * 0x18);
  uVar3 = *(ushort *)(ixy[1].driver_name + uVar16 * 0x18 + 0x12);
  uVar12 = (uint)uVar3;
  uVar8 = (uint)uVar3;
  for (uVar16 = 0; uVar14 = uVar12, uVar17 = (ulong)num_bufs, num_bufs != uVar16;
      uVar16 = uVar16 + 1) {
    uVar13 = uVar14 & 0xffff;
    uVar12 = *(uint *)(*plVar1 + 8 + (ulong)(uVar13 << 4));
    uVar17 = uVar16;
    if ((uVar12 & 1) == 0) break;
    if ((uVar12 & 2) == 0) {
      __format = 
      "[ERROR] %s:%d %s(): multi-segment packets are not supported - increase buffer size or decrease MTU\n"
      ;
      uVar11 = 0x2a8;
LAB_001046b2:
      fprintf(_stderr,__format,
              "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c",
              uVar11,"ixgbe_rx_batch");
      abort();
    }
    plVar15 = (long *)(*plVar1 + (ulong)(uVar13 << 4));
    ppVar5 = (pkt_buf *)plVar1[(ulong)uVar13 + 3];
    ppVar5->size = (uint)*(ushort *)((long)plVar15 + 0xc);
    ppVar9 = pkt_buf_alloc((mempool *)plVar1[1]);
    if (ppVar9 == (pkt_buf *)0x0) {
      __format = 
      "[ERROR] %s:%d %s(): failed to allocate new mbuf for rx, you are either leaking memory or your mempool is too small\n"
      ;
      uVar11 = 0x2b5;
      goto LAB_001046b2;
    }
    *plVar15 = ppVar9->buf_addr_phy + 0x40;
    plVar15[1] = 0;
    plVar1[(ulong)uVar13 + 3] = (long)ppVar9;
    bufs[uVar16] = ppVar5;
    uVar12 = (int)plVar1[2] - 1U & uVar14 + 1;
    uVar8 = uVar14;
  }
  uVar12 = (uint)queue_id;
  if ((short)uVar14 != (short)uVar8) {
    uVar13 = uVar12 * 0x40 + 0xc018;
    if (queue_id < 0x40) {
      uVar13 = uVar12 * 0x40 | 0x1018;
    }
    *(uint *)(ixy[1].pci_addr + uVar13) = uVar8 & 0xffff;
    *(short *)((long)plVar1 + 0x12) = (short)uVar14;
  }
  if (_Var2 != false) {
    auVar7 = vpmovsxbq_avx(ZEXT216(0x101));
    uVar16 = local_58->instr_counter;
    auVar6 = vpinsrq_avx(auVar7,uVar17 & 0xffffffff,1);
    auVar7._0_8_ = local_58->instr_counter;
    auVar7._8_8_ = local_58->rx_pkts;
    auVar7 = vpaddq_avx(auVar6,auVar7);
    local_58->instr_counter = auVar7._0_8_;
    local_58->rx_pkts = auVar7._8_8_;
    if ((uVar16 & 0xfff) == 0) {
      _Var2 = local_58->interrupt_enabled;
      uVar10 = monotonic_time();
      uVar16 = uVar10 - local_58->last_time_checked;
      if (local_58->interval < uVar16) {
        check_interrupt(local_58,uVar16,(uint32_t)uVar17,num_bufs);
      }
      if (_Var2 != local_58->interrupt_enabled) {
        if (local_58->interrupt_enabled == false) {
          *(uint *)(ixy[1].pci_addr + 0x880) =
               *(uint *)(ixy[1].pci_addr + 0x880) & ~(1 << (uVar12 & 0x1f));
          *(int *)(ixy[1].pci_addr + 0x888) = 1 << (uVar12 & 0x1f);
          fprintf(_stderr,"[DEBUG] %s:%d %s(): Using polling\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c"
                  ,0x74,"disable_interrupt");
        }
        else {
          enable_interrupt((ixgbe_device *)ixy,queue_id);
        }
      }
    }
  }
  return (uint32_t)uVar17;
}

Assistant:

uint32_t ixgbe_rx_batch(struct ixy_device* ixy, uint16_t queue_id, struct pkt_buf* bufs[], uint32_t num_bufs) {
	struct ixgbe_device* dev = IXY_TO_IXGBE(ixy);

	struct interrupt_queues* interrupt = NULL;
	bool interrupts_enabled = ixy->interrupts.interrupts_enabled;

	if (interrupts_enabled) {
		interrupt = &ixy->interrupts.queues[queue_id];
	}

	if (interrupts_enabled && interrupt->interrupt_enabled) {
		vfio_epoll_wait(interrupt->vfio_epoll_fd, 10, dev->ixy.interrupts.timeout_ms);
	}

	struct ixgbe_rx_queue* queue = ((struct ixgbe_rx_queue*) (dev->rx_queues)) + queue_id;
	uint16_t rx_index = queue->rx_index; // rx index we checked in the last run of this function
	uint16_t last_rx_index = rx_index; // index of the descriptor we checked in the last iteration of the loop
	uint32_t buf_index;
	for (buf_index = 0; buf_index < num_bufs; buf_index++) {
		// rx descriptors are explained in 7.1.5
		volatile union ixgbe_adv_rx_desc* desc_ptr = queue->descriptors + rx_index;
		uint32_t status = desc_ptr->wb.upper.status_error;
		if (status & IXGBE_RXDADV_STAT_DD) {
			if (!(status & IXGBE_RXDADV_STAT_EOP)) {
				error("multi-segment packets are not supported - increase buffer size or decrease MTU");
			}
			// got a packet, read and copy the whole descriptor
			union ixgbe_adv_rx_desc desc = *desc_ptr;
			struct pkt_buf* buf = (struct pkt_buf*) queue->virtual_addresses[rx_index];
			buf->size = desc.wb.upper.length;
			// this would be the place to implement RX offloading by translating the device-specific flags
			// to an independent representation in the buf (similiar to how DPDK works)
			// need a new mbuf for the descriptor
			struct pkt_buf* new_buf = pkt_buf_alloc(queue->mempool);
			if (!new_buf) {
				// we could handle empty mempools more gracefully here, but it would be quite messy...
				// make your mempools large enough
				error("failed to allocate new mbuf for rx, you are either leaking memory or your mempool is too small");
			}
			// reset the descriptor
			desc_ptr->read.pkt_addr = new_buf->buf_addr_phy + offsetof(struct pkt_buf, data);
			desc_ptr->read.hdr_addr = 0; // this resets the flags
			queue->virtual_addresses[rx_index] = new_buf;
			bufs[buf_index] = buf;
			// want to read the next one in the next iteration, but we still need the last/current to update RDT later
			last_rx_index = rx_index;
			rx_index = wrap_ring(rx_index, queue->num_entries);
		} else {
			break;
		}
	}
	if (rx_index != last_rx_index) {
		// tell hardware that we are done
		// this is intentionally off by one, otherwise we'd set RDT=RDH if we are receiving faster than packets are coming in
		// RDT=RDH means queue is full
		set_reg32(dev->addr, IXGBE_RDT(queue_id), last_rx_index);
		queue->rx_index = rx_index;
	}

	if (interrupts_enabled) {
		interrupt->rx_pkts += buf_index;

		if ((interrupt->instr_counter++ & 0xFFF) == 0) {
			bool int_en = interrupt->interrupt_enabled;
			uint64_t diff = monotonic_time() - interrupt->last_time_checked;
			if (diff > interrupt->interval) {
				// every second
				check_interrupt(interrupt, diff, buf_index, num_bufs);
			}

			if (int_en != interrupt->interrupt_enabled) {
				if (interrupt->interrupt_enabled) {
					enable_interrupt(dev, queue_id);
				} else {
					disable_interrupt(dev, queue_id);
				}
			}
		}
	}

	return buf_index; // number of packets stored in bufs; buf_index points to the next index
}